

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFactoryRegistry.cpp
# Opt level: O2

TestFactoryRegistry * __thiscall
CppUnit::TestFactoryRegistryList::getInternalRegistry(TestFactoryRegistryList *this,string *name)

{
  iterator iVar1;
  TestFactoryRegistry *this_00;
  string sStack_68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>
  local_48;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->m_registries)._M_t._M_impl.super__Rb_tree_header)
  {
    this_00 = (TestFactoryRegistry *)operator_new(0x58);
    std::__cxx11::string::string((string *)&sStack_68,(string *)name);
    TestFactoryRegistry::TestFactoryRegistry(this_00,&sStack_68);
    std::__cxx11::string::~string((string *)&sStack_68);
    std::__cxx11::string::string((string *)&local_48,(string *)name);
    local_48.second = this_00;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,CppUnit::TestFactoryRegistry*>,std::_Select1st<std::pair<std::__cxx11::string_const,CppUnit::TestFactoryRegistry*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,CppUnit::TestFactoryRegistry*>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,CppUnit::TestFactoryRegistry*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,CppUnit::TestFactoryRegistry*>,std::_Select1st<std::pair<std::__cxx11::string_const,CppUnit::TestFactoryRegistry*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,CppUnit::TestFactoryRegistry*>>>
                *)this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    this_00 = *(TestFactoryRegistry **)(iVar1._M_node + 2);
  }
  return this_00;
}

Assistant:

TestFactoryRegistry *getInternalRegistry( const std::string &name )
  {
    Registries::const_iterator foundIt = m_registries.find( name );
    if ( foundIt == m_registries.end() )
    {
      TestFactoryRegistry *factory = new TestFactoryRegistry( name );
      m_registries.insert( std::pair<const std::string, TestFactoryRegistry*>( name, factory ) );
      return factory;
    }
    return (*foundIt).second;
  }